

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemFlags extra_flags)

{
  short *psVar1;
  ImGuiItemStatusFlags *pIVar2;
  int *piVar3;
  float fVar4;
  ImGuiNavLayer IVar5;
  uint uVar6;
  int iVar7;
  ImGuiWindow *window_00;
  ImGuiWindow *pIVar8;
  ImVec2 IVar9;
  ImGuiContext *pIVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  bool bVar13;
  ImGuiID id_1;
  ImGuiNavItemData *pIVar14;
  ImGuiContext *g;
  ImGuiWindow *window;
  uint uVar15;
  ImGuiContext *g_1;
  float fVar16;
  float fVar17;
  ImRect IVar18;
  ImRect nav_bb;
  
  pIVar10 = GImGui;
  window_00 = GImGui->CurrentWindow;
  (GImGui->LastItemData).ID = id;
  IVar9 = bb->Max;
  (pIVar10->LastItemData).Rect.Min = bb->Min;
  (pIVar10->LastItemData).Rect.Max = IVar9;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  IVar9 = nav_bb_arg->Max;
  (pIVar10->LastItemData).NavRect.Min = nav_bb_arg->Min;
  (pIVar10->LastItemData).NavRect.Max = IVar9;
  uVar15 = extra_flags | pIVar10->CurrentItemFlags;
  (pIVar10->LastItemData).InFlags = uVar15;
  (pIVar10->LastItemData).StatusFlags = 0;
  if (id == 0) goto LAB_001155be;
  IVar5 = (window_00->DC).NavLayerCurrent;
  psVar1 = &(window_00->DC).NavLayersActiveMaskNext;
  *psVar1 = *psVar1 | (ushort)(1 << ((byte)IVar5 & 0x1f));
  if ((((pIVar10->NavId != id) && (pIVar10->NavAnyRequest != true)) ||
      (pIVar8 = pIVar10->NavWindow, pIVar8->RootWindowForNav != window_00->RootWindowForNav)) ||
     ((window_00 != pIVar8 && (((uint)(pIVar8->Flags | window_00->Flags) >> 0x17 & 1) == 0))))
  goto LAB_001155be;
  nav_bb.Min = (pIVar10->LastItemData).NavRect.Min;
  nav_bb.Max = (pIVar10->LastItemData).NavRect.Max;
  if ((pIVar10->NavInitRequest == true) && (pIVar10->NavLayer == IVar5)) {
    if ((uVar15 & 0x14) == 0) {
      pIVar10->NavInitResultId = id;
      IVar18 = WindowRectAbsToRel(window_00,&nav_bb);
      pIVar10->NavInitResultRectRel = IVar18;
      pIVar10->NavInitRequest = false;
      bVar12 = true;
      if (GImGui->NavMoveScoringItems == false) {
        bVar12 = GImGui->NavInitRequest;
      }
      GImGui->NavAnyRequest = bVar12;
    }
    else if (pIVar10->NavInitResultId == 0) {
      pIVar10->NavInitResultId = id;
      IVar18 = WindowRectAbsToRel(window_00,&nav_bb);
      pIVar10->NavInitResultRectRel = IVar18;
    }
  }
  pIVar11 = GImGui;
  if (pIVar10->NavMoveScoringItems == true) {
    uVar6 = pIVar10->NavMoveFlags;
    if ((uVar6 >> 10 & 1) == 0) {
      if ((uVar15 & 0xc) == 0 && ((uVar6 & 0x10) != 0 || pIVar10->NavId != id)) {
        pIVar14 = &pIVar10->NavMoveResultOther;
        if (window_00 == pIVar10->NavWindow) {
          pIVar14 = &pIVar10->NavMoveResultLocal;
        }
        bVar12 = NavScoreItem(pIVar14);
        if (bVar12) {
          NavApplyItemToResult(pIVar14);
        }
        if (((pIVar10->NavMoveFlags & 0x20) != 0) &&
           (bVar12 = ImRect::Overlaps(&window_00->ClipRect,&nav_bb), bVar12)) {
          fVar4 = (window_00->ClipRect).Min.y;
          fVar16 = (window_00->ClipRect).Max.y;
          fVar17 = fVar16;
          if (nav_bb.Max.y <= fVar16) {
            fVar17 = nav_bb.Max.y;
          }
          if (nav_bb.Min.y <= fVar16) {
            fVar16 = nav_bb.Min.y;
          }
          if ((nav_bb.Max.y - nav_bb.Min.y) * 0.7 <=
              (float)(-(uint)(nav_bb.Max.y < fVar4) & (uint)fVar4 |
                     ~-(uint)(nav_bb.Max.y < fVar4) & (uint)fVar17) -
              (float)(-(uint)(nav_bb.Min.y < fVar4) & (uint)fVar4 |
                     ~-(uint)(nav_bb.Min.y < fVar4) & (uint)fVar16)) {
            pIVar14 = &pIVar10->NavMoveResultLocalVisible;
            bVar12 = NavScoreItem(pIVar14);
            if (bVar12) goto LAB_001158ea;
          }
        }
      }
    }
    else if ((uVar15 & 0x105) == 0x100 || (uVar6 >> 9 & 1) != 0) {
      pIVar14 = &GImGui->NavMoveResultLocal;
      iVar7 = GImGui->NavTabbingDir;
      if (iVar7 == -1) {
        if (GImGui->NavId == id) {
          if ((GImGui->NavMoveResultLocal).ID != 0) {
            GImGui->NavMoveScoringItems = false;
            pIVar11->NavAnyRequest = pIVar11->NavInitRequest;
          }
        }
        else {
LAB_001158ea:
          NavApplyItemToResult(pIVar14);
        }
      }
      else if (iVar7 == 0) {
        if ((GImGui->NavTabbingResultFirst).ID == 0) {
          pIVar14 = &GImGui->NavTabbingResultFirst;
LAB_001158f7:
          NavMoveRequestResolveWithLastItem(pIVar14);
        }
      }
      else if (iVar7 == 1) {
        if ((GImGui->NavTabbingResultFirst).ID == 0) {
          NavApplyItemToResult(&GImGui->NavTabbingResultFirst);
        }
        piVar3 = &pIVar11->NavTabbingCounter;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) goto LAB_001158f7;
        if (pIVar11->NavId == id) {
          pIVar11->NavTabbingCounter = 1;
        }
      }
    }
  }
  if (pIVar10->NavId == id) {
    pIVar10->NavWindow = window_00;
    pIVar10->NavLayer = (window_00->DC).NavLayerCurrent;
    pIVar10->NavFocusScopeId = (window_00->DC).NavFocusScopeIdCurrent;
    pIVar10->NavIdIsAlive = true;
    IVar18 = WindowRectAbsToRel(window_00,&nav_bb);
    window_00->NavRectRel[(window_00->DC).NavLayerCurrent] = IVar18;
  }
LAB_001155be:
  (pIVar10->NextItemData).Flags = 0;
  bVar12 = IsClippedEx(bb,id);
  if ((!bVar12) && (bVar13 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar13)) {
    pIVar2 = &(pIVar10->LastItemData).StatusFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  }
  return !bVar12;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Set item data
    // (DisplayRect is left untouched, made valid when ImGuiItemStatusFlags_HasDisplayRect is set)
    g.LastItemData.ID = id;
    g.LastItemData.Rect = bb;
    g.LastItemData.NavRect = nav_bb_arg ? *nav_bb_arg : bb;
    g.LastItemData.InFlags = g.CurrentItemFlags | extra_flags;
    g.LastItemData.StatusFlags = ImGuiItemStatusFlags_None;

    // Directional navigation processing
    if (id != 0)
    {
        // Runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem();

        // [DEBUG] People keep stumbling on this problem and using "" as identifier in the root of a window instead of "##something".
        // Empty identifier are valid and useful in a small amount of cases, but 99.9% of the time you want to use "##something".
        // READ THE FAQ: https://dearimgui.org/faq
        IM_ASSERT(id != window->ID && "Cannot have an empty ID at the root of a window. If you need an empty label, use ## and read the FAQ about how the ID Stack works!");

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}